

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Bullet(void)

{
  bool bVar1;
  float fVar2;
  ImU32 text_col;
  ImRect bb;
  float line_height;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  undefined4 in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  ImRect *in_stack_ffffffffffffff90;
  ImVec2 pos;
  ImVec2 *this;
  ImRect *nav_bb_arg;
  undefined1 local_50 [4];
  ImGuiID in_stack_ffffffffffffffb4;
  ImRect *in_stack_ffffffffffffffb8;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImRect local_2c;
  float local_1c;
  ImGuiStyle *local_18;
  ImGuiContext *local_10;
  ImGuiWindow *local_8;
  
  local_8 = GetCurrentWindow();
  if ((local_8->SkipItems & 1U) == 0) {
    local_10 = GImGui;
    local_18 = &GImGui->Style;
    fVar2 = (GImGui->Style).FramePadding.y;
    fVar2 = ImMin<float>((local_8->DC).CurrLineSize.y,fVar2 + fVar2 + GImGui->FontSize);
    local_1c = ImMax<float>(fVar2,local_10->FontSize);
    nav_bb_arg = (ImRect *)&local_8->DC;
    this = &local_3c;
    ImVec2::ImVec2(this,local_10->FontSize,local_1c);
    local_34 = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                         (ImVec2 *)0x1791d8);
    ImRect::ImRect(&local_2c,&nav_bb_arg->Min,&local_34);
    ItemSize(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    bVar1 = ItemAdd(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,nav_bb_arg,
                    (ImGuiItemFlags)((ulong)this >> 0x20));
    if (bVar1) {
      GetColorU32((ImGuiCol)((ulong)this >> 0x20),SUB84(this,0));
      pos = (ImVec2)local_50;
      ImVec2::ImVec2((ImVec2 *)pos,local_10->FontSize * 0.5 + (local_18->FramePadding).x,
                     local_1c * 0.5);
      operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                (ImVec2 *)0x1792ac);
      RenderBullet((ImDrawList *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),pos,0
                  );
      SameLine(pos.y,pos.x);
    }
    else {
      SameLine((float)((ulong)in_stack_ffffffffffffff90 >> 0x20),SUB84(in_stack_ffffffffffffff90,0))
      ;
    }
  }
  return;
}

Assistant:

void ImGui::Bullet()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const float line_height = ImMax(ImMin(window->DC.CurrLineSize.y, g.FontSize + g.Style.FramePadding.y * 2), g.FontSize);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(g.FontSize, line_height));
    ItemSize(bb);
    if (!ItemAdd(bb, 0))
    {
        SameLine(0, style.FramePadding.x * 2);
        return;
    }

    // Render and stay on same line
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderBullet(window->DrawList, bb.Min + ImVec2(style.FramePadding.x + g.FontSize * 0.5f, line_height * 0.5f), text_col);
    SameLine(0, style.FramePadding.x * 2.0f);
}